

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  uint uVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined4 uVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  float fVar14;
  float fVar15;
  undefined4 uVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  long lVar22;
  size_t sVar23;
  long lVar24;
  unsigned_long uVar25;
  ulong uVar26;
  float *pfVar27;
  uint *puVar28;
  long lVar29;
  vuint<4> vgeomID;
  Vec3vf<4> v0;
  Vec3vf<4> v1;
  Vec3vf<4> v2;
  vuint<4> vprimID;
  ulong local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong local_f8;
  PrimRef *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8 [8];
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8 [8];
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78 [8];
  long local_58;
  BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleM<4>_>_> *local_50;
  uint local_48 [6];
  
  uVar25 = set->_begin;
  uVar19 = (set->_end - uVar25) + 3;
  local_f8 = uVar19 >> 2;
  local_108 = local_f8 * 0xb0;
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  local_f0 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,(ThreadLocal2 **)&local_88);
    }
    else {
      *__position._M_current = local_88;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)uStack_e0 == '\x01') {
      MutexSys::unlock(local_e8);
    }
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  pTVar5->bytesUsed = pTVar5->bytesUsed + local_108;
  sVar23 = pTVar5->cur;
  uVar26 = (ulong)(-(int)sVar23 & 0xf);
  uVar20 = sVar23 + local_108 + uVar26;
  pTVar5->cur = uVar20;
  if (pTVar5->end < uVar20) {
    pTVar5->cur = sVar23;
    if (pTVar5->allocBlockSize < local_108 << 2) {
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_108);
    }
    else {
      local_e8 = (MutexSys *)pTVar5->allocBlockSize;
      pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar5->ptr = pcVar21;
      sVar23 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar23;
      pTVar5->cur = 0;
      pTVar5->end = (size_t)local_e8;
      pTVar5->cur = local_108;
      if (local_e8 < local_108) {
        pTVar5->cur = 0;
        local_e8 = (MutexSys *)pTVar5->allocBlockSize;
        pcVar21 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar5->ptr = pcVar21;
        sVar23 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar23;
        pTVar5->cur = 0;
        pTVar5->end = (size_t)local_e8;
        pTVar5->cur = local_108;
        if (local_e8 < local_108) {
          pTVar5->cur = 0;
          pcVar21 = (char *)0x0;
        }
        else {
          pTVar5->bytesWasted = sVar23;
        }
      }
      else {
        pTVar5->bytesWasted = sVar23;
      }
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar26;
    pcVar21 = pTVar5->ptr + (uVar20 - local_108);
  }
  if (3 < uVar19) {
    lVar22 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar24 = 0;
    local_58 = lVar22;
    local_50 = this;
    do {
      uVar19 = set->_end;
      local_108 = 0xffffffffffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_d8[4] = 0.0;
      local_d8[5] = 0.0;
      local_d8[6] = 0.0;
      local_d8[7] = 0.0;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      local_d8[3] = 0.0;
      local_e8 = (MutexSys *)0x0;
      uStack_e0 = 0;
      local_a8[4] = 0.0;
      local_a8[5] = 0.0;
      local_a8[6] = 0.0;
      local_a8[7] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_a8[2] = 0.0;
      local_a8[3] = 0.0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_78[4] = 0.0;
      local_78[5] = 0.0;
      local_78[6] = 0.0;
      local_78[7] = 0.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      if (uVar25 < uVar19) {
        pRVar6 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar28 = (uint *)((long)local_f0 + uVar25 * 0x20);
        uVar20 = 0;
        do {
          uVar4 = *puVar28;
          pGVar7 = pRVar6[puVar28[-4]].ptr;
          lVar29 = (ulong)uVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar22 = *(long *)&pGVar7->field_0x58;
          lVar8 = *(long *)&pGVar7[1].time_range.upper;
          p_Var9 = pGVar7[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar22 + lVar29) * (long)p_Var9);
          uVar10 = *puVar2;
          fVar11 = (float)puVar2[1];
          fVar12 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar22 + 4 + lVar29) * (long)p_Var9);
          uVar13 = *puVar2;
          fVar14 = (float)puVar2[1];
          fVar15 = (float)puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar22 + 8 + lVar29) * (long)p_Var9);
          uVar16 = *puVar2;
          fVar17 = (float)puVar2[1];
          fVar18 = (float)puVar2[2];
          *(uint *)((long)&local_108 + uVar20 * 4) = puVar28[-4];
          local_48[uVar20] = uVar4;
          *(undefined4 *)((long)&local_e8 + uVar20 * 4) = uVar10;
          local_d8[uVar20] = fVar11;
          local_d8[uVar20 + 4] = fVar12;
          *(undefined4 *)((long)&local_b8 + uVar20 * 4) = uVar13;
          local_a8[uVar20] = fVar14;
          local_a8[uVar20 + 4] = fVar15;
          *(undefined4 *)((long)&local_88 + uVar20 * 4) = uVar16;
          local_78[uVar20] = fVar17;
          local_78[uVar20 + 4] = fVar18;
          uVar26 = uVar20 + 1;
          if (2 < uVar20) break;
          lVar22 = uVar20 + uVar25;
          puVar28 = puVar28 + 8;
          uVar20 = uVar26;
        } while (lVar22 + 1U < uVar19);
        uVar25 = uVar25 + uVar26;
        lVar22 = local_58;
        this = local_50;
      }
      pfVar27 = (float *)(pcVar21 + lVar24 * 0xb0);
      *pfVar27 = (float)local_e8;
      pfVar27[1] = local_e8._4_4_;
      pfVar27[2] = (float)uStack_e0;
      pfVar27[3] = uStack_e0._4_4_;
      pfVar27[4] = local_d8[0];
      pfVar27[5] = local_d8[1];
      pfVar27[6] = local_d8[2];
      pfVar27[7] = local_d8[3];
      pfVar27[8] = local_d8[4];
      pfVar27[9] = local_d8[5];
      pfVar27[10] = local_d8[6];
      pfVar27[0xb] = local_d8[7];
      pfVar27[0xc] = (float)local_e8 - (float)local_b8;
      pfVar27[0xd] = local_e8._4_4_ - local_b8._4_4_;
      pfVar27[0xe] = (float)uStack_e0 - (float)uStack_b0;
      pfVar27[0xf] = uStack_e0._4_4_ - uStack_b0._4_4_;
      pfVar27[0x10] = local_d8[0] - local_a8[0];
      pfVar27[0x11] = local_d8[1] - local_a8[1];
      pfVar27[0x12] = local_d8[2] - local_a8[2];
      pfVar27[0x13] = local_d8[3] - local_a8[3];
      pfVar27[0x14] = local_d8[4] - local_a8[4];
      pfVar27[0x15] = local_d8[5] - local_a8[5];
      pfVar27[0x16] = local_d8[6] - local_a8[6];
      pfVar27[0x17] = local_d8[7] - local_a8[7];
      pfVar27[0x18] = (float)local_88 - (float)local_e8;
      pfVar27[0x19] = local_88._4_4_ - local_e8._4_4_;
      pfVar27[0x1a] = (float)uStack_80 - (float)uStack_e0;
      pfVar27[0x1b] = uStack_80._4_4_ - uStack_e0._4_4_;
      pfVar27[0x1c] = local_78[0] - local_d8[0];
      pfVar27[0x1d] = local_78[1] - local_d8[1];
      pfVar27[0x1e] = local_78[2] - local_d8[2];
      pfVar27[0x1f] = local_78[3] - local_d8[3];
      pfVar27[0x20] = local_78[4] - local_d8[4];
      pfVar27[0x21] = local_78[5] - local_d8[5];
      pfVar27[0x22] = local_78[6] - local_d8[6];
      pfVar27[0x23] = local_78[7] - local_d8[7];
      *(ulong *)(pfVar27 + 0x24) = local_108;
      *(ulong *)(pfVar27 + 0x26) = CONCAT44(uStack_fc,uStack_100);
      *(ulong *)(pfVar27 + 0x28) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pfVar27 + 0x2a) = CONCAT44(local_48[3],local_48[2]);
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar22);
  }
  uVar19 = 7;
  if (local_f8 < 7) {
    uVar19 = local_f8;
  }
  return (NodeRef)(uVar19 | (ulong)pcVar21 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }